

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularString::GenerateMemberConstexprConstructor
          (SingularString *this,Printer *p)

{
  Printer *pPVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  Printer *local_18;
  Printer *p_local;
  SingularString *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  bVar2 = FieldGeneratorBase::is_inlined(&this->super_FieldGeneratorBase);
  pPVar1 = local_18;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,"$name$_(nullptr, false)");
    io::Printer::SourceLocation::current();
    io::Printer::Emit(pPVar1,local_28._M_len,local_28._M_str);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,
               "$name$_(\n    &$pbi$::fixed_address_empty_string,\n    ::_pbi::ConstantInitialized())"
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit(pPVar1,local_40._M_len,local_40._M_str);
  }
  return;
}

Assistant:

void GenerateMemberConstexprConstructor(io::Printer* p) const override {
    if (is_inlined()) {
      p->Emit("$name$_(nullptr, false)");
    } else {
      p->Emit(
          "$name$_(\n"
          "    &$pbi$::fixed_address_empty_string,\n"
          "    ::_pbi::ConstantInitialized())");
    }
  }